

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O3

Curl_addrinfo * Curl_he2ai(hostent *he,int port)

{
  int iVar1;
  Curl_addrinfo *pCVar2;
  char *pcVar3;
  sockaddr *psVar4;
  Curl_addrinfo *cahead;
  Curl_addrinfo *pCVar5;
  long lVar6;
  char *pcVar7;
  
  if ((he == (hostent *)0x0) || (pcVar7 = *he->h_addr_list, pcVar7 == (char *)0x0)) {
LAB_00567ccc:
    cahead = (Curl_addrinfo *)0x0;
  }
  else {
    lVar6 = 8;
    cahead = (Curl_addrinfo *)0x0;
    pCVar5 = (Curl_addrinfo *)0x0;
    do {
      pCVar2 = (Curl_addrinfo *)(*Curl_ccalloc)(1,0x30);
      if (pCVar2 == (Curl_addrinfo *)0x0) {
LAB_00567cc4:
        Curl_freeaddrinfo(cahead);
        goto LAB_00567ccc;
      }
      pcVar3 = (*Curl_cstrdup)(he->h_name);
      pCVar2->ai_canonname = pcVar3;
      if (pcVar3 == (char *)0x0) {
LAB_00567cb8:
        (*Curl_cfree)(pCVar2);
        goto LAB_00567cc4;
      }
      psVar4 = (sockaddr *)(*Curl_ccalloc)(1,0x10);
      pCVar2->ai_addr = psVar4;
      if (psVar4 == (sockaddr *)0x0) {
        (*Curl_cfree)(pCVar2->ai_canonname);
        goto LAB_00567cb8;
      }
      if (cahead == (Curl_addrinfo *)0x0) {
        cahead = pCVar2;
      }
      if (pCVar5 != (Curl_addrinfo *)0x0) {
        pCVar5->ai_next = pCVar2;
      }
      iVar1 = he->h_addrtype;
      pCVar2->ai_family = iVar1;
      pCVar2->ai_socktype = 1;
      pCVar2->ai_addrlen = 0x10;
      if (iVar1 == 2) {
        *(undefined4 *)(psVar4->sa_data + 2) = *(undefined4 *)pcVar7;
        psVar4->sa_family = (sa_family_t)he->h_addrtype;
        *(ushort *)psVar4->sa_data = (ushort)port << 8 | (ushort)port >> 8;
      }
      pcVar7 = *(char **)((long)he->h_addr_list + lVar6);
      lVar6 = lVar6 + 8;
      pCVar5 = pCVar2;
    } while (pcVar7 != (char *)0x0);
  }
  return cahead;
}

Assistant:

Curl_addrinfo *
Curl_he2ai(const struct hostent *he, int port)
{
  Curl_addrinfo *ai;
  Curl_addrinfo *prevai = NULL;
  Curl_addrinfo *firstai = NULL;
  struct sockaddr_in *addr;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 *addr6;
#endif
  CURLcode result = CURLE_OK;
  int i;
  char *curr;

  if(!he)
    /* no input == no output! */
    return NULL;

  DEBUGASSERT((he->h_name != NULL) && (he->h_addr_list != NULL));

  for(i=0; (curr = he->h_addr_list[i]) != NULL; i++) {

    size_t ss_size;
#ifdef ENABLE_IPV6
    if(he->h_addrtype == AF_INET6)
      ss_size = sizeof (struct sockaddr_in6);
    else
#endif
      ss_size = sizeof (struct sockaddr_in);

    if((ai = calloc(1, sizeof(Curl_addrinfo))) == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      break;
    }
    if((ai->ai_canonname = strdup(he->h_name)) == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      free(ai);
      break;
    }
    if((ai->ai_addr = calloc(1, ss_size)) == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      free(ai->ai_canonname);
      free(ai);
      break;
    }

    if(!firstai)
      /* store the pointer we want to return from this function */
      firstai = ai;

    if(prevai)
      /* make the previous entry point to this */
      prevai->ai_next = ai;

    ai->ai_family = he->h_addrtype;

    /* we return all names as STREAM, so when using this address for TFTP
       the type must be ignored and conn->socktype be used instead! */
    ai->ai_socktype = SOCK_STREAM;

    ai->ai_addrlen = (curl_socklen_t)ss_size;

    /* leave the rest of the struct filled with zero */

    switch (ai->ai_family) {
    case AF_INET:
      addr = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr->sin_addr, curr, sizeof(struct in_addr));
      addr->sin_family = (unsigned short)(he->h_addrtype);
      addr->sin_port = htons((unsigned short)port);
      break;

#ifdef ENABLE_IPV6
    case AF_INET6:
      addr6 = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr6->sin6_addr, curr, sizeof(struct in6_addr));
      addr6->sin6_family = (unsigned short)(he->h_addrtype);
      addr6->sin6_port = htons((unsigned short)port);
      break;
#endif
    }

    prevai = ai;
  }

  if(result != CURLE_OK) {
    Curl_freeaddrinfo(firstai);
    firstai = NULL;
  }

  return firstai;
}